

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

bool __thiscall sf::Texture::create(Texture *this,uint width,uint height)

{
  Uint64 UVar1;
  uint uVar2;
  ostream *poVar3;
  Vector2u VVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  TransientContextLock lock;
  TextureSaver save;
  GLuint texture;
  
  if (width == 0 || height == 0) {
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Failed to create texture, invalid size (",0x28);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar9 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::ensureExtensionsInit();
    uVar7 = width;
    if (sfogl_ext_ARB_texture_non_power_of_two == 0) {
      uVar8 = 1;
      do {
        uVar7 = uVar8;
        uVar8 = uVar7 * 2;
      } while (uVar7 < width);
    }
    uVar8 = height;
    if (sfogl_ext_ARB_texture_non_power_of_two == 0) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        uVar2 = uVar8 * 2;
      } while (uVar8 < height);
    }
    uVar2 = getMaximumSize();
    bVar9 = uVar8 <= uVar2 && uVar7 <= uVar2;
    if (uVar8 <= uVar2 && uVar7 <= uVar2) {
      (this->m_size).x = width;
      (this->m_size).y = height;
      VVar4.y = uVar8;
      VVar4.x = uVar7;
      this->m_actualSize = VVar4;
      this->m_pixelsFlipped = false;
      this->m_fboAttachment = false;
      if (this->m_texture == 0) {
        glGenTextures(1,&texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0xa2,"glGenTextures(1, &texture)");
        this->m_texture = texture;
      }
      priv::TextureSaver::TextureSaver(&save);
      if (create(unsigned_int,unsigned_int)::textureEdgeClamp == '\0') {
        create();
      }
      if (((this->m_isRepeated == false) && (create::textureEdgeClamp == false)) &&
         (create(unsigned_int,unsigned_int)::warned == '\0')) {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"OpenGL extension SGIS_texture_edge_clamp unavailable",0x34);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Artifacts may occur along texture edges",0x27);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Ensure that hardware acceleration is enabled if available",0x39);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        create(unsigned_int,unsigned_int)::warned = '\x01';
      }
      if (create(unsigned_int,unsigned_int)::textureSrgb == '\0') {
        create();
      }
      if ((this->m_sRgb == true) && (create::textureSrgb == false)) {
        if (create(unsigned_int,unsigned_int)::warned == '\0') {
          poVar3 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"OpenGL extension EXT_texture_sRGB unavailable",0x2d);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          poVar3 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Automatic sRGB to linear conversion disabled",0x2c);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          create(unsigned_int,unsigned_int)::warned = '\x01';
        }
        this->m_sRgb = false;
      }
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xcf,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      uVar5 = 0x1908;
      if (this->m_sRgb != false) {
        uVar5 = 0x8c43;
      }
      glTexImage2D(0xde1,0,uVar5,(this->m_actualSize).x,(this->m_actualSize).y,0,0x1908,0x1401,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd0,
                         "glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL)"
                        );
      uVar5 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        uVar5 = 0x812f;
      }
      uVar6 = 0x2901;
      if (this->m_isRepeated == false) {
        uVar6 = uVar5;
      }
      glTexParameteri(0xde1,0x2802,uVar6);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd1,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                        );
      uVar5 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        uVar5 = 0x812f;
      }
      uVar6 = 0x2901;
      if (this->m_isRepeated == false) {
        uVar6 = uVar5;
      }
      glTexParameteri(0xde1,0x2803,uVar6);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd2,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                        );
      glTexParameteri(0xde1,0x2800,this->m_isSmooth | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd3,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd4,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      Lock::Lock((Lock *)&texture,(Mutex *)&(anonymous_namespace)::idMutex);
      UVar1 = (anonymous_namespace)::getUniqueId()::id;
      (anonymous_namespace)::getUniqueId()::id = (anonymous_namespace)::getUniqueId()::id + 1;
      Lock::~Lock((Lock *)&texture);
      this->m_cacheId = UVar1;
      this->m_hasMipmap = false;
      priv::TextureSaver::~TextureSaver(&save);
    }
    else {
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Failed to create texture, its internal size is too high ",0x38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"maximum is ",0xb);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  return bVar9;
}

Assistant:

bool Texture::create(unsigned int width, unsigned int height)
{
    // Check if texture parameters are valid before creating it
    if ((width == 0) || (height == 0))
    {
        err() << "Failed to create texture, invalid size (" << width << "x" << height << ")" << std::endl;
        return false;
    }

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    // Compute the internal texture dimensions depending on NPOT textures support
    Vector2u actualSize(getValidSize(width), getValidSize(height));

    // Check the maximum texture size
    unsigned int maxSize = getMaximumSize();
    if ((actualSize.x > maxSize) || (actualSize.y > maxSize))
    {
        err() << "Failed to create texture, its internal size is too high "
              << "(" << actualSize.x << "x" << actualSize.y << ", "
              << "maximum is " << maxSize << "x" << maxSize << ")"
              << std::endl;
        return false;
    }

    // All the validity checks passed, we can store the new texture settings
    m_size.x        = width;
    m_size.y        = height;
    m_actualSize    = actualSize;
    m_pixelsFlipped = false;
    m_fboAttachment = false;

    // Create the OpenGL texture if it doesn't exist yet
    if (!m_texture)
    {
        GLuint texture;
        glCheck(glGenTextures(1, &texture));
        m_texture = static_cast<unsigned int>(texture);
    }

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

    if (!m_isRepeated && !textureEdgeClamp)
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
            err() << "Artifacts may occur along texture edges" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    static bool textureSrgb = GLEXT_texture_sRGB;

    if (m_sRgb && !textureSrgb)
    {
        static bool warned = false;

        if (!warned)
        {
#ifndef SFML_OPENGL_ES
            err() << "OpenGL extension EXT_texture_sRGB unavailable" << std::endl;
#else
            err() << "OpenGL ES extension EXT_sRGB unavailable" << std::endl;
#endif
            err() << "Automatic sRGB to linear conversion disabled" << std::endl;

            warned = true;
        }

        m_sRgb = false;
    }

    // Initialize the texture
    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    m_cacheId = getUniqueId();

    m_hasMipmap = false;

    return true;
}